

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

string * __thiscall inja::Token::describe_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  Kind KVar1;
  char *pcVar2;
  char *pcVar3;
  
  KVar1 = this->kind;
  if (KVar1 == Eof) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "<eof>";
    pcVar2 = "";
  }
  else if (KVar1 == LineStatementClose) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "<eol>";
    pcVar2 = "";
  }
  else if (KVar1 == Text) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "<text>";
    pcVar2 = "";
  }
  else {
    pcVar3 = (this->text).data_;
    pcVar2 = pcVar3 + (this->text).size_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string describe() const {
		switch (kind) {
			case Kind::Text:
				return "<text>";
			case Kind::LineStatementClose:
				return "<eol>";
			case Kind::Eof:
				return "<eof>";
			default:
				return static_cast<std::string>(text);
		}
	}